

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 152.hpp
# Opt level: O2

invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
* __thiscall
njoy::ENDFtk::section::Type<2,_152>::EUNR
          (invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
           *__return_storage_ptr__,Type<2,_152> *this)

{
  long lVar1;
  subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>
  local_18;
  
  lVar1 = ((_Head_base<3UL,_long,_false> *)
          ((long)&(this->data_).metadata.fields.
                  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                  super__Tuple_impl<2UL,_long,_long,_long,_long>.
                  super__Tuple_impl<3UL,_long,_long,_long> + 0x10))->_M_head_impl;
  local_18.data_.
  super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
  .
  super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
  ._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       ((this->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start + (int)lVar1);
  local_18.data_.
  super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
  .
  super__Tuple_impl<1UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
  .
  super__Head_base<1UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
  ._M_head_impl._M_current =
       (_Head_base<1UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
        )(this->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish;
  ranges::views::view_closure_base_ns::
  operator|<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_ranges::detail::bind_back_fn_<ranges::views::stride_base_fn,_int>,_true,_0,_0>
            (__return_storage_ptr__,&local_18,
             (view_closure<ranges::detail::bind_back_fn_<ranges::views::stride_base_fn,_int>_>)
             (lVar1 * 0x500000000 + 0x100000000));
  return __return_storage_ptr__;
}

Assistant:

auto EUNR() const {

      return this->data_.list()
               | ranges::views::drop_exactly( this->NSIGZ() )
               | ranges::views::stride( 1 + this->NSIGZ() * 5 );
    }